

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O1

pair<Elf64_Sym,_unsigned_long> * __thiscall
pstack::Elf::Object::findDynamicSymbol
          (pair<Elf64_Sym,_unsigned_long> *__return_storage_ptr__,Object *this,string *name)

{
  uchar uVar1;
  uchar uVar2;
  Elf64_Section EVar3;
  Elf64_Addr EVar4;
  GnuHash *pGVar5;
  SymHash *pSVar6;
  Sym sym;
  pair<unsigned_int,_Elf64_Sym> local_48;
  
  pGVar5 = get_hash<pstack::Elf::GnuHash>(this,&this->gnu_hash_);
  if (pGVar5 == (GnuHash *)0x0) {
    pSVar6 = get_hash<pstack::Elf::SymHash>(this,&this->hash_);
    if (pSVar6 == (SymHash *)0x0) {
      undef();
      local_48.first = 0;
      local_48.second.st_name = undef::theUndef.undefSym.st_name;
      local_48.second.st_info = undef::theUndef.undefSym.st_info;
      local_48.second.st_other = undef::theUndef.undefSym.st_other;
      local_48.second.st_shndx = undef::theUndef.undefSym.st_shndx;
      local_48.second.st_value = undef::theUndef.undefSym.st_value;
      local_48.second.st_size = undef::theUndef.undefSym.st_size;
    }
    else {
      pSVar6 = get_hash<pstack::Elf::SymHash>(this,&this->hash_);
      SymHash::findSymbol(&local_48,pSVar6,name);
    }
  }
  else {
    pGVar5 = get_hash<pstack::Elf::GnuHash>(this,&this->gnu_hash_);
    GnuHash::findSymbol(&local_48,pGVar5,(name->_M_dataplus)._M_p);
  }
  if ((ulong)local_48.first == 0) {
    undef();
    EVar4 = undef::theUndef.undefSym.st_value;
    uVar1 = undef::theUndef.undefSym.st_info;
    uVar2 = undef::theUndef.undefSym.st_other;
    EVar3 = undef::theUndef.undefSym.st_shndx;
    (__return_storage_ptr__->first).st_name = undef::theUndef.undefSym.st_name;
    (__return_storage_ptr__->first).st_info = uVar1;
    (__return_storage_ptr__->first).st_other = uVar2;
    (__return_storage_ptr__->first).st_shndx = EVar3;
    (__return_storage_ptr__->first).st_value = EVar4;
    (__return_storage_ptr__->first).st_size = undef::theUndef.undefSym.st_size;
    __return_storage_ptr__->second = 0;
  }
  else {
    (__return_storage_ptr__->first).st_size = local_48.second.st_size;
    (__return_storage_ptr__->first).st_name = local_48.second.st_name;
    (__return_storage_ptr__->first).st_info = local_48.second.st_info;
    (__return_storage_ptr__->first).st_other = local_48.second.st_other;
    (__return_storage_ptr__->first).st_shndx = local_48.second.st_shndx;
    (__return_storage_ptr__->first).st_value = local_48.second.st_value;
    __return_storage_ptr__->second = (ulong)local_48.first;
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<Sym, size_t>
Object::findDynamicSymbol(const std::string &name)
{
    Sym sym;
    uint32_t idx;

    std::tie(idx, sym) = gnu_hash() ? gnu_hash()->findSymbol(name)
             : hash() ? hash()->findSymbol(name)
             : std::make_pair(uint32_t(0), undef());

    if (idx == 0)
        return { undef() , 0 };

    // We found a symbol in our hash table. Find its version if we can.
    return {sym, idx};
}